

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  byte *pbVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  stbi__context *psVar6;
  
  do {
    if (j->nomore == 0) {
      psVar6 = j->s;
      pbVar1 = psVar6->img_buffer;
      if (pbVar1 < psVar6->img_buffer_end) {
        psVar6->img_buffer = pbVar1 + 1;
        bVar2 = *pbVar1;
      }
      else {
        if (psVar6->read_from_callbacks == 0) goto LAB_0011afab;
        psVar5 = psVar6->buffer_start;
        iVar4 = (*(psVar6->io).read)(psVar6->io_user_data,(char *)psVar5,psVar6->buflen);
        if (iVar4 == 0) {
          psVar6->read_from_callbacks = 0;
          psVar5 = psVar6->buffer_start + 1;
          psVar6->buffer_start[0] = '\0';
          bVar2 = 0;
        }
        else {
          bVar2 = *psVar5;
          psVar5 = psVar5 + iVar4;
        }
        psVar6->img_buffer_end = psVar5;
        psVar6->img_buffer = psVar6->buffer_start + 1;
      }
      if (bVar2 == 0xff) {
        psVar6 = j->s;
        psVar5 = psVar6->img_buffer;
        if (psVar6->img_buffer_end <= psVar5) {
          if (psVar6->read_from_callbacks != 0) goto LAB_0011b075;
          sVar3 = '\0';
          goto LAB_0011b055;
        }
        do {
          psVar6->img_buffer = psVar5 + 1;
          sVar3 = *psVar5;
LAB_0011b055:
          while( true ) {
            if (sVar3 != 0xff) {
              if (sVar3 != '\0') {
                j->marker = sVar3;
                j->nomore = 1;
                return;
              }
              bVar2 = 0xff;
              goto LAB_0011b0c7;
            }
            psVar6 = j->s;
            psVar5 = psVar6->img_buffer;
            if (psVar5 < psVar6->img_buffer_end) break;
            sVar3 = '\0';
            if (psVar6->read_from_callbacks != 0) {
LAB_0011b075:
              psVar5 = psVar6->buffer_start;
              iVar4 = (*(psVar6->io).read)(psVar6->io_user_data,(char *)psVar5,psVar6->buflen);
              if (iVar4 == 0) {
                psVar6->read_from_callbacks = 0;
                psVar5 = psVar6->buffer_start + 1;
                psVar6->buffer_start[0] = '\0';
                sVar3 = '\0';
              }
              else {
                sVar3 = *psVar5;
                psVar5 = psVar5 + iVar4;
              }
              psVar6->img_buffer_end = psVar5;
              psVar6->img_buffer = psVar6->buffer_start + 1;
            }
          }
        } while( true );
      }
    }
    else {
LAB_0011afab:
      bVar2 = 0;
    }
LAB_0011b0c7:
    iVar4 = j->code_bits;
    j->code_buffer = j->code_buffer | (uint)bVar2 << ((byte)(0x18 - (char)iVar4) & 0x1f);
    j->code_bits = iVar4 + 8;
    if (0x10 < iVar4) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}